

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O2

void __thiscall cornerstone::raft_server::handle_voting_resp(raft_server *this,resp_msg *resp)

{
  unsigned_long args;
  unsigned_long args_1;
  element_type *peVar1;
  iterator iVar2;
  char *pcVar3;
  ulong uVar4;
  strfmt<100> *this_00;
  shared_lock<std::shared_timed_mutex> rlock;
  allocator<char> local_b9;
  undefined1 local_b8 [32];
  shared_lock<std::shared_timed_mutex> local_98;
  strfmt<100> local_88;
  
  args = (resp->super_msg_base).term_;
  args_1 = ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->term_;
  if (args == args_1) {
    if (this->election_completed_ == true) {
      peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,
                 "Election completed, will ignore the voting result from this server",
                 (allocator<char> *)local_b8);
      (*peVar1->_vptr_logger[3])(peVar1,&local_88);
      this_00 = &local_88;
      goto LAB_001476b8;
    }
    local_88.buf_._0_4_ = (resp->super_msg_base).src_;
    iVar2 = std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->voted_servers_)._M_h,(key_type_conflict *)&local_88);
    if (iVar2.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
      local_98._M_pm = &this->peers_lock_;
      local_98._M_owns = true;
      std::__shared_mutex_pthread::lock_shared(&(local_98._M_pm)->super___shared_timed_mutex_base);
      local_88.buf_._0_4_ = (resp->super_msg_base).src_;
      std::__detail::
      _Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&this->voted_servers_,(value_type *)&local_88);
      if (resp->accepted_ == true) {
        this->votes_granted_ = this->votes_granted_ + 1;
      }
      uVar4 = (this->peers_)._M_h._M_element_count + 1;
      if (uVar4 <= (this->voted_servers_)._M_h._M_element_count) {
        this->election_completed_ = true;
      }
      if ((int)(uVar4 >> 1) < this->votes_granted_) {
        peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_88.fmt_ = "Server is elected as leader for term %llu";
        pcVar3 = strfmt<100>::fmt<unsigned_long>
                           (&local_88,
                            ((this->state_).
                             super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->term_);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,pcVar3,&local_b9);
        (*peVar1->_vptr_logger[3])(peVar1,local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        this->election_completed_ = true;
        become_leader(this);
      }
      std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_98);
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88.fmt_ = "Duplicate vote from %d for term %lld";
    pcVar3 = strfmt<100>::fmt<int,unsigned_long>
                       (&local_88,(resp->super_msg_base).src_,
                        ((this->state_).
                         super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->term_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,pcVar3,(allocator<char> *)&local_98);
    (*peVar1->_vptr_logger[3])(peVar1,local_b8);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88.fmt_ = "Received an outdated vote response at term %llu v.s. current term %llu";
    pcVar3 = strfmt<100>::fmt<unsigned_long,unsigned_long>(&local_88,args,args_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,pcVar3,(allocator<char> *)&local_98);
    (*peVar1->_vptr_logger[3])(peVar1,local_b8);
  }
  this_00 = (strfmt<100> *)local_b8;
LAB_001476b8:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void raft_server::handle_voting_resp(resp_msg& resp)
{
    if (resp.get_term() != state_->get_term())
    {
        l_->info(sstrfmt("Received an outdated vote response at term %llu v.s. current term %llu")
                     .fmt(resp.get_term(), state_->get_term()));
        return;
    }

    if (election_completed_)
    {
        l_->info("Election completed, will ignore the voting result from this server");
        return;
    }

    if (voted_servers_.find(resp.get_src()) != voted_servers_.end())
    {
        l_->info(sstrfmt("Duplicate vote from %d for term %lld").fmt(resp.get_src(), state_->get_term()));
        return;
    }

    {
        read_lock(peers_lock_);
        voted_servers_.insert(resp.get_src());
        if (resp.get_accepted())
        {
            votes_granted_ += 1;
        }

        if (voted_servers_.size() >= (peers_.size() + 1))
        {
            election_completed_ = true;
        }

        if (votes_granted_ > (int32)((peers_.size() + 1) / 2))
        {
            l_->info(sstrfmt("Server is elected as leader for term %llu").fmt(state_->get_term()));
            election_completed_ = true;
            become_leader();
        }
    }
}